

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

void sort_5_4::test(void)

{
  undefined4 *puVar1;
  
  ps_int((int *)&DAT_00104190,10);
  merge_sort_1((int *)&DAT_00104190,0,9);
  puVar1 = &graph_5_4::visited;
  do {
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  } while( true );
}

Assistant:

void test() {
        int a[] = {12, 4, 16, 34, 6, 5, 8, 11, 38, 25};
        ps_int(a, 10);
//        bubble_sort_1(a, 10);
//        select_sort(a, 10);
//        insert_sort_1(a, 10);
//        insert_b_sort_1(a, 10);
//        shell_sort_1(a, 10);
//        quick_sort_1(a, 0, 10);
//        heap_sort_1(a, 10);
        merge_sort_1(a, 0, 9);
        ps_int(a, 10);
    }